

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# super.c
# Opt level: O0

int Super_CommandSupergatesAnd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  FILE *__stream;
  uint local_44;
  int c;
  int fVerbose;
  int nLevels;
  int nVarsMax;
  FILE *pErr;
  FILE *pOut;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  fVerbose = 4;
  c = 3;
  local_44 = 0;
  Extra_UtilGetoptReset();
  do {
    while( true ) {
      while( true ) {
        iVar1 = Extra_UtilGetopt(argc,argv,"ILvh");
        if (iVar1 == -1) {
          Super2_Precompute(fVerbose,c,local_44);
          return 0;
        }
        if (iVar1 != 0x49) break;
        fVerbose = atoi(argv[globalUtilOptind]);
        globalUtilOptind = globalUtilOptind + 1;
        if (fVerbose < 0) goto LAB_00443374;
      }
      if (iVar1 == 0x4c) break;
      if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_00443374;
      local_44 = local_44 ^ 1;
    }
    c = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
  } while (-1 < c);
LAB_00443374:
  fprintf(__stream,"usage: super2 [-IL num] [-vh]\n");
  fprintf(__stream,"\t         precomputes the supergates composed of AND2s and INVs\n");
  fprintf(__stream,"\t-I num : the max number of inputs to the supergate [default = %d]\n",
          (ulong)(uint)fVerbose);
  fprintf(__stream,"\t-L num : the max number of logic levels of gates [default = %d]\n",
          (ulong)(uint)c);
  fprintf(__stream,"\t-v     : enable verbose output\n");
  fprintf(__stream,"\t-h     : print the help message\n");
  return 1;
}

Assistant:

int Super_CommandSupergatesAnd( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pOut, * pErr;
    int nVarsMax, nLevels;
    int fVerbose;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    nVarsMax = 4;
    nLevels  = 3;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "ILvh")) != EOF ) 
    {
        switch (c) 
        {
            case 'I':
                nVarsMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nVarsMax < 0 ) 
                    goto usage;
                break;
            case 'L':
                nLevels = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nLevels < 0 ) 
                    goto usage;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }

    Super2_Precompute( nVarsMax, nLevels, fVerbose );

    return 0;

usage:
    fprintf( pErr, "usage: super2 [-IL num] [-vh]\n");
    fprintf( pErr, "\t         precomputes the supergates composed of AND2s and INVs\n" );  
    fprintf( pErr, "\t-I num : the max number of inputs to the supergate [default = %d]\n", nVarsMax );
    fprintf( pErr, "\t-L num : the max number of logic levels of gates [default = %d]\n", nLevels );
    fprintf( pErr, "\t-v     : enable verbose output\n");
    fprintf( pErr, "\t-h     : print the help message\n");
    return 1;       /* error exit */
}